

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O2

Vec_Int_t *
Fra_SmlSelectMaxCost(Vec_Int_t *vImps,int *pCosts,int nCostMax,int nImpLimit,int *pCostRange)

{
  int iVar1;
  int *__ptr;
  ulong uVar2;
  Vec_Int_t *p;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = vImps->nSize;
  if ((int)uVar5 < nImpLimit) {
    __assert_fail("Vec_IntSize(vImps) >= nImpLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraImp.c"
                  ,0xf8,"Vec_Int_t *Fra_SmlSelectMaxCost(Vec_Int_t *, int *, int, int, int *)");
  }
  __ptr = (int *)calloc(1,(long)nCostMax * 4 + 4);
  uVar2 = 0;
  uVar3 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    if (nCostMax < pCosts[uVar2]) {
      __assert_fail("pCosts[i] <= nCostMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraImp.c"
                    ,0xfe,"Vec_Int_t *Fra_SmlSelectMaxCost(Vec_Int_t *, int *, int, int, int *)");
    }
    __ptr[pCosts[uVar2]] = __ptr[pCosts[uVar2]] + 1;
  }
  if (*__ptr == 0) {
    uVar5 = nCostMax >> 0x1f & nCostMax;
    iVar1 = 0;
    while ((uVar6 = uVar5, 0 < nCostMax &&
           (iVar1 = iVar1 + __ptr[(uint)nCostMax], uVar6 = nCostMax, iVar1 < nImpLimit))) {
      nCostMax = nCostMax - 1;
    }
    p = Vec_IntAlloc(nImpLimit);
    lVar4 = 0;
    while ((lVar4 < vImps->nSize &&
           ((iVar1 = Vec_IntEntry(vImps,(int)lVar4), pCosts[lVar4] < (int)uVar6 ||
            (Vec_IntPush(p,iVar1), p->nSize != nImpLimit))))) {
      lVar4 = lVar4 + 1;
    }
    free(__ptr);
    if (pCostRange != (int *)0x0) {
      *pCostRange = uVar6;
    }
    return p;
  }
  __assert_fail("pCostCount[0] == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraImp.c"
                ,0x101,"Vec_Int_t *Fra_SmlSelectMaxCost(Vec_Int_t *, int *, int, int, int *)");
}

Assistant:

Vec_Int_t * Fra_SmlSelectMaxCost( Vec_Int_t * vImps, int * pCosts, int nCostMax, int nImpLimit, int * pCostRange )
{
    Vec_Int_t * vImpsNew;
    int * pCostCount, nImpCount, Imp, i, c;
    assert( Vec_IntSize(vImps) >= nImpLimit );
    // count how many implications have each cost
    pCostCount = ABC_ALLOC( int, nCostMax + 1 );
    memset( pCostCount, 0, sizeof(int) * (nCostMax + 1) );
    for ( i = 0; i < Vec_IntSize(vImps); i++ )
    {
        assert( pCosts[i] <= nCostMax );
        pCostCount[ pCosts[i] ]++;
    }
    assert( pCostCount[0] == 0 );
    // select the bound on the cost (above this bound, implication will be included)
    nImpCount = 0;
    for ( c = nCostMax; c > 0; c-- )
    {
        nImpCount += pCostCount[c];
        if ( nImpCount >= nImpLimit )
            break;
    }
//    printf( "Cost range >= %d.\n", c );
    // collect implications with the given costs
    vImpsNew = Vec_IntAlloc( nImpLimit );
    Vec_IntForEachEntry( vImps, Imp, i )
    {
        if ( pCosts[i] < c )
            continue;
        Vec_IntPush( vImpsNew, Imp );
        if ( Vec_IntSize( vImpsNew ) == nImpLimit )
            break;
    }
    ABC_FREE( pCostCount );
    if ( pCostRange )
        *pCostRange = c;
    return vImpsNew;
}